

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::ValidateReadBuffer
          (ShaderImageLoadStoreBase *this,int x,int y,int w,int h,vec4 *expected)

{
  pointer pVVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 in_register_0000000c;
  float *pfVar8;
  Vector<float,_4> *v;
  ulong uVar9;
  int iVar10;
  Vector<float,_4> *pVVar11;
  byte bVar12;
  bool bVar13;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> fb;
  string local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  long lVar7;
  
  pfVar8 = (float *)CONCAT44(in_register_0000000c,w);
  iVar6 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext
            [4])();
  lVar7 = CONCAT44(extraout_var,iVar6);
  bVar2 = *(byte *)(lVar7 + 8);
  bVar3 = *(byte *)(lVar7 + 0xc);
  bVar4 = *(byte *)(lVar7 + 0x10);
  bVar5 = *(byte *)(lVar7 + 0x14);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&fb,(long)(y * x),(allocator_type *)&local_68);
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0,0,x,y,0x1908,0x1406,
             fb.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  bVar12 = 1;
  if (y < 1) {
    bVar13 = true;
  }
  else {
    v = (Vector<float,_4> *)0x0;
    bVar13 = false;
    iVar6 = 0;
    do {
      uVar9 = (ulong)(uint)x;
      pVVar11 = v;
      if (0 < x) {
        do {
          iVar10 = (int)pVVar11;
          pVVar1 = fb.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + iVar10;
          if ((((1.0 / (float)(1 << (bVar2 & 0x1f)) <
                 ABS(fb.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar10].m_data[0] - *pfVar8)) ||
               (1.0 / (float)(1 << (bVar3 & 0x1f)) < ABS(pVVar1->m_data[1] - pfVar8[1]))) ||
              (1.0 / (float)(1 << (bVar4 & 0x1f)) < ABS(pVVar1->m_data[2] - pfVar8[2]))) ||
             (1.0 / (float)(1 << (bVar5 & 0x1f)) < ABS(pVVar1->m_data[3] - pfVar8[3]))) {
            local_48 = *(undefined8 *)pVVar1->m_data;
            uStack_40 = *(undefined8 *)(pVVar1->m_data + 2);
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>
                      (&local_68,&local_48,v);
            anon_unknown_0::Output("First bad color: %s.\n",local_68._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            bVar12 = 0;
            goto LAB_0098e1c2;
          }
          pVVar11 = (Vector<float,_4> *)(ulong)(iVar10 + 1);
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      iVar6 = iVar6 + 1;
      v = (Vector<float,_4> *)(ulong)(uint)((int)v + x);
      bVar13 = y <= iVar6;
    } while (iVar6 != y);
  }
LAB_0098e1c2:
  if (fb.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(fb.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)fb.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)fb.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (bool)(bVar13 & bVar12);
}

Assistant:

bool ValidateReadBuffer(int x, int y, int w, int h, const vec4& expected)
	{
		bool					 status		  = true;
		const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
		const tcu::PixelFormat&  pixelFormat  = renderTarget.getPixelFormat();
		vec4					 g_color_eps  = vec4(
			1.f / static_cast<float>(1 << pixelFormat.redBits), 1.f / static_cast<float>(1 << pixelFormat.greenBits),
			1.f / static_cast<float>(1 << pixelFormat.blueBits), 1.f / static_cast<float>(1 << pixelFormat.alphaBits));

		std::vector<vec4> fb(w * h);
		glReadPixels(x, y, w, h, GL_RGBA, GL_FLOAT, &fb[0]);

		for (int yy = 0; yy < h; ++yy)
		{
			for (int xx = 0; xx < w; ++xx)
			{
				const int idx = yy * w + xx;
				if (!ColorEqual(fb[idx], expected, g_color_eps))
				{
					Output("First bad color: %s.\n", ToString(fb[idx]).c_str());
					status = false;
					return status;
				}
			}
		}
		return status;
	}